

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ExprReferencesUpdatedColumn(Expr *pExpr,int *aiChng,int chngRowid)

{
  ushort uVar1;
  u16 uVar2;
  long in_FS_OFFSET;
  Walker local_48;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.pParse = (Parse *)0x0;
  local_48.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
  local_48.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
  local_48.walkerDepth = 0;
  local_48.eCode = 0;
  local_48.mWFlags = 0;
  local_48.xExprCallback = checkConstraintExprNode;
  local_48.u.aiCol = aiChng;
  if (pExpr == (Expr *)0x0) {
    uVar2 = 0;
  }
  else {
    sqlite3WalkExprNN(&local_48,pExpr);
    uVar2 = local_48.eCode;
  }
  uVar1 = uVar2 & 0xfffd;
  if (chngRowid != 0) {
    uVar1 = uVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (int)(uVar1 != 0);
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprReferencesUpdatedColumn(
  Expr *pExpr,    /* The expression to be checked */
  int *aiChng,    /* aiChng[x]>=0 if column x changed by the UPDATE */
  int chngRowid   /* True if UPDATE changes the rowid */
){
  Walker w;
  memset(&w, 0, sizeof(w));
  w.eCode = 0;
  w.xExprCallback = checkConstraintExprNode;
  w.u.aiCol = aiChng;
  sqlite3WalkExpr(&w, pExpr);
  if( !chngRowid ){
    testcase( (w.eCode & CKCNSTRNT_ROWID)!=0 );
    w.eCode &= ~CKCNSTRNT_ROWID;
  }
  testcase( w.eCode==0 );
  testcase( w.eCode==CKCNSTRNT_COLUMN );
  testcase( w.eCode==CKCNSTRNT_ROWID );
  testcase( w.eCode==(CKCNSTRNT_ROWID|CKCNSTRNT_COLUMN) );
  return w.eCode!=0;
}